

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O0

void ldamath::expdigammify<float,(lda_math_mode)1>
               (vw *all,float *gamma,float threshold,float initial)

{
  anon_class_8_2_969ef1a5 in_RSI;
  long in_RDI;
  undefined4 in_XMM0_Da;
  float fVar1;
  float in_XMM1_Da;
  float sum;
  undefined4 in_stack_ffffffffffffffd8;
  
  std::accumulate<float*,float>
            ((float *)in_RSI,(float *)((long)in_RSI + (ulong)*(uint *)(in_RDI + 0x3478) * 4),
             in_XMM1_Da);
  fVar1 = digamma<float,(lda_math_mode)1>(0.0);
  std::
  transform<float*,float*,ldamath::expdigammify<float,(lda_math_mode)1>(vw&,float*,float,float)::_lambda(float)_1_>
            ((float *)CONCAT44(in_XMM0_Da,in_XMM1_Da),(float *)CONCAT44(fVar1,in_XMM0_Da),
             (float *)CONCAT44(fVar1,in_stack_ffffffffffffffd8),in_RSI);
  return;
}

Assistant:

inline void expdigammify(vw &all, T *gamma, T threshold, T initial)
{
  T sum = digamma<T, mtype>(std::accumulate(gamma, gamma + all.lda, initial));

  std::transform(gamma, gamma + all.lda, gamma,
      [sum, threshold](T g) { return fmax(threshold, exponential<T, mtype>(digamma<T, mtype>(g) - sum)); });
}